

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

void __thiscall
pybind11::cpp_function::cpp_function<void,Job,std::__cxx11::string_const&>
          (cpp_function *this,offset_in_Job_to_subr f)

{
  function_record *rec;
  void *in_RDX;
  descr<22UL,_1UL> signature;
  char local_48 [24];
  type_info *ptStack_30;
  undefined8 local_28;
  
  (this->super_function).super_object.super_handle.m_ptr = (PyObject *)0x0;
  rec = make_function_record(this);
  rec->data[0] = (void *)f;
  rec->data[1] = in_RDX;
  rec->impl = initialize<pybind11::cpp_function::initialize<void,Job,std::__cxx11::string_const&>(void(Job::*)(std::__cxx11::string_const&))::{lambda(pybind11::detail::function_record*,pybind11::handle,pybind11::handle,pybind11::handle)#1}(Job*,std::__cxx11::string_const&)#1},void,Job*,std::__cxx11::string_const&>(pybind11::cpp_function::initialize<void,Job,std::__cxx11::string_const&>(void(Job::*)(std::__cxx11::string_const&))::{lambda(pybind11::detail::function_record*,pybind11::handle,pybind11::handle,pybind11::handle)#1}(Job*,std::__cxx11::string_const&)#1}&&,void(*)(Job*,std::__cxx11::string_const&))
              ::
              {lambda(pybind11::detail::function_record*,pybind11::handle,pybind11::handle,pybind11::handle)#1}
              ::handle_;
  local_28 = 0;
  builtin_strncpy(local_48 + 0x10,"{None}",7);
  local_48[0x17] = '\0';
  ptStack_30 = (type_info *)&Job::typeinfo;
  builtin_strncpy(local_48,"({%}, {str}) -> ",0x10);
  initialize_generic(this,rec,local_48,&ptStack_30,2);
  return;
}

Assistant:

cpp_function(Return (Class::*f)(Arg...) PYBIND11_NOEXCEPT_SPECIFIER, const Extra&... extra) {
        initialize([f](Class *c, Arg... args) -> Return { return (c->*f)(args...); },
                   (Return (*) (Class *, Arg...) PYBIND11_NOEXCEPT_SPECIFIER) nullptr, extra...);
    }